

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
          ::dx(&this->left_->fadexpr_,i);
  vVar2 = FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>::dx
                    (&this->right_->fadexpr_,i);
  return vVar2 + vVar1;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}